

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O0

void Bmc_CexDumpAogStats(Gia_Man_t *p,abctime clk)

{
  uint uVar1;
  FILE *__stream;
  FILE *pTable;
  abctime clk_local;
  Gia_Man_t *p_local;
  
  __stream = fopen("cex/aig_stats.txt","a+");
  fprintf(__stream,"%s ",p->pName);
  uVar1 = Gia_ManPiNum(p);
  fprintf(__stream,"%d ",(ulong)uVar1);
  uVar1 = Gia_ManAndNum(p);
  fprintf(__stream,"%d ",(ulong)uVar1);
  uVar1 = Gia_ManLevelNum(p);
  fprintf(__stream,"%d ",(ulong)uVar1);
  fprintf(__stream,"%.2f ",((double)clk * 1.0) / 1000000.0);
  fprintf(__stream,"\n");
  fclose(__stream);
  return;
}

Assistant:

void Bmc_CexDumpAogStats( Gia_Man_t * p, abctime clk )
{
    FILE * pTable  = fopen( "cex/aig_stats.txt", "a+" );
    fprintf( pTable, "%s ", p->pName );
    fprintf( pTable, "%d ", Gia_ManPiNum(p) );
    fprintf( pTable, "%d ", Gia_ManAndNum(p) );
    fprintf( pTable, "%d ", Gia_ManLevelNum(p) );
    fprintf( pTable, "%.2f ", 1.0*clk/(CLOCKS_PER_SEC) );
    fprintf( pTable, "\n" );
    fclose( pTable );
}